

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
 __thiscall
duckdb::ProduceArrowScan
          (duckdb *this,ArrowScanFunctionData *function,vector<unsigned_long,_true> *column_ids,
          TableFilterSet *filters)

{
  ArrowSchema *pAVar1;
  value_type vVar2;
  const_reference pvVar3;
  mapped_type *this_00;
  ArrowType *this_01;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  value_type col_idx;
  size_type local_d8;
  TableFilterSet *local_d0;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_c8;
  ArrowStreamParameters parameters;
  
  parameters.projected_columns.projection_map._M_h._M_buckets =
       &parameters.projected_columns.projection_map._M_h._M_single_bucket;
  parameters.projected_columns.projection_map._M_h._M_bucket_count = 1;
  parameters.projected_columns.projection_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  parameters.projected_columns.projection_map._M_h._M_element_count = 0;
  parameters.projected_columns.projection_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  parameters.projected_columns.filter_to_col._M_h._M_buckets =
       &parameters.projected_columns.filter_to_col._M_h._M_single_bucket;
  parameters.projected_columns.columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parameters.projected_columns.projection_map._M_h._M_rehash_policy._M_next_resize = 0;
  parameters.projected_columns.projection_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  parameters.projected_columns.columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.projected_columns.columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parameters.projected_columns.filter_to_col._M_h._M_bucket_count = 1;
  parameters.projected_columns.filter_to_col._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  parameters.projected_columns.filter_to_col._M_h._M_element_count = 0;
  parameters.projected_columns.filter_to_col._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  parameters.projected_columns.filter_to_col._M_h._M_rehash_policy._M_next_resize = 0;
  parameters.projected_columns.filter_to_col._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d0 = filters;
  local_c8 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)ArrowTableType::GetColumns(&function->arrow_table);
  for (local_d8 = 0;
      local_d8 <
      (ulong)((long)(column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3); local_d8 = local_d8 + 1) {
    pvVar3 = vector<unsigned_long,_true>::get<true>(column_ids,local_d8);
    col_idx = *pvVar3;
    if (col_idx != 0xffffffffffffffff) {
      pAVar1 = (function->schema_root).arrow_schema.children[col_idx];
      this_00 = ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at(local_c8,&col_idx);
      this_01 = shared_ptr<duckdb::ArrowType,_true>::operator->(this_00);
      ArrowType::ThrowIfInvalid(this_01);
      pmVar4 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&parameters,&local_d8);
      ::std::__cxx11::string::assign((char *)pmVar4);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &parameters.projected_columns.columns,&pAVar1->name);
      vVar2 = col_idx;
      pmVar5 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&parameters.projected_columns.filter_to_col,&local_d8);
      *pmVar5 = vVar2;
    }
  }
  parameters.filters = local_d0;
  (*function->scanner_producer)
            ((uintptr_t)this,(ArrowStreamParameters *)function->stream_factory_ptr);
  ArrowProjectedColumns::~ArrowProjectedColumns(&parameters.projected_columns);
  return (unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
          )(unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
            )this;
}

Assistant:

unique_ptr<ArrowArrayStreamWrapper> ProduceArrowScan(const ArrowScanFunctionData &function,
                                                     const vector<column_t> &column_ids, TableFilterSet *filters) {
	//! Generate Projection Pushdown Vector
	ArrowStreamParameters parameters;
	D_ASSERT(!column_ids.empty());
	auto &arrow_types = function.arrow_table.GetColumns();
	for (idx_t idx = 0; idx < column_ids.size(); idx++) {
		auto col_idx = column_ids[idx];
		if (col_idx != COLUMN_IDENTIFIER_ROW_ID) {
			auto &schema = *function.schema_root.arrow_schema.children[col_idx];
			arrow_types.at(col_idx)->ThrowIfInvalid();
			parameters.projected_columns.projection_map[idx] = schema.name;
			parameters.projected_columns.columns.emplace_back(schema.name);
			parameters.projected_columns.filter_to_col[idx] = col_idx;
		}
	}
	parameters.filters = filters;
	return function.scanner_producer(function.stream_factory_ptr, parameters);
}